

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall
chatra::RuntimeImp::push
          (RuntimeImp *this,InstanceId interactiveInstanceId,string *scriptName,string *statement)

{
  lock_guard<chatra::SpinLock> lVar1;
  lock_guard<chatra::SpinLock> lVar2;
  bool bVar3;
  Instance *pIVar4;
  IllegalArgumentException *pIVar5;
  reference ppVar6;
  unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_> *this_00;
  pointer pTVar7;
  UnsupportedOperationException *this_01;
  element_type *peVar8;
  vector<chatra::Frame,std::allocator<chatra::Frame>> *this_02;
  pointer scope;
  reference pvVar9;
  value_type *f;
  int local_9c;
  shared_ptr<chatra::Node> local_98;
  lock_guard<chatra::SpinLock> local_88;
  lock_guard<chatra::SpinLock> lock0_1;
  Package *package;
  unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_> *t;
  pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>
  *e;
  iterator __end2;
  iterator __begin2;
  unordered_map<chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>,_std::hash<chatra::Requester>,_std::equal_to<chatra::Requester>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>_>
  *__range2;
  lock_guard<chatra::SpinLock> lock0;
  Thread *thread;
  Instance *instance;
  string *statement_local;
  string *scriptName_local;
  InstanceId interactiveInstanceId_local;
  RuntimeImp *this_local;
  
  pIVar4 = IdPool<chatra::InstanceId,_chatra::Instance>::lockAndRef
                     (&this->instanceIds,interactiveInstanceId);
  if (pIVar4 == (Instance *)0x0) {
    pIVar5 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
    memset(pIVar5,0,0x28);
    IllegalArgumentException::IllegalArgumentException(pIVar5);
    __cxa_throw(pIVar5,&IllegalArgumentException::typeinfo,
                IllegalArgumentException::~IllegalArgumentException);
  }
  lock0._M_device = (mutex_type *)0x0;
  std::lock_guard<chatra::SpinLock>::lock_guard
            ((lock_guard<chatra::SpinLock> *)&__range2,&pIVar4->lockThreads);
  __end2 = std::
           unordered_map<chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>,_std::hash<chatra::Requester>,_std::equal_to<chatra::Requester>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>_>
           ::begin(&pIVar4->threads);
  e = (pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>
       *)std::
         unordered_map<chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>,_std::hash<chatra::Requester>,_std::equal_to<chatra::Requester>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>_>
         ::end(&pIVar4->threads);
  do {
    bVar3 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_false>
                         *)&e);
    if (!bVar3) {
      std::lock_guard<chatra::SpinLock>::~lock_guard((lock_guard<chatra::SpinLock> *)&__range2);
      if (lock0._M_device != (mutex_type *)0x0) {
        std::atomic<bool>::operator=((atomic<bool> *)(lock0._M_device + 0x29),false);
        lock0_1._M_device =
             (mutex_type *)
             IdPool<chatra::PackageId,_chatra::Package>::lockAndRef
                       (&this->packageIds,pIVar4->primaryPackageId);
        std::vector<chatra::Script,std::allocator<chatra::Script>>::
        emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((vector<chatra::Script,std::allocator<chatra::Script>> *)
                   &((Package *)lock0_1._M_device)->super_PackageInfo,scriptName,statement);
        std::lock_guard<chatra::SpinLock>::lock_guard(&local_88,&this->lockTrashNodes);
        std::
        forward_list<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        emplace_front<std::shared_ptr<chatra::Node>>
                  ((forward_list<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)&this->trashNodes,(shared_ptr<chatra::Node> *)(lock0_1._M_device + 0xb8));
        std::make_shared<chatra::Node>();
        std::shared_ptr<chatra::Node>::operator=
                  ((shared_ptr<chatra::Node> *)(lock0_1._M_device + 0xb8),&local_98);
        std::shared_ptr<chatra::Node>::~shared_ptr(&local_98);
        peVar8 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(lock0_1._M_device + 0xb8));
        peVar8->type = ScriptRoot;
        peVar8 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(lock0_1._M_device + 0xb8));
        peVar8->flags = peVar8->flags | 4;
        std::lock_guard<chatra::SpinLock>::~lock_guard(&local_88);
        lVar2 = lock0;
        lVar1 = lock0_1;
        this_02 = (vector<chatra::Frame,std::allocator<chatra::Frame>> *)(lock0._M_device + 0x68);
        local_9c = 1;
        f = (value_type *)
            std::unique_ptr<chatra::Scope,_std::default_delete<chatra::Scope>_>::get
                      ((unique_ptr<chatra::Scope,_std::default_delete<chatra::Scope>_> *)
                       (lock0_1._M_device + 0x90));
        std::vector<chatra::Frame,std::allocator<chatra::Frame>>::
        emplace_back<chatra::Thread&,chatra::Package&,int,chatra::Scope*>
                  (this_02,(Thread *)lVar2._M_device,(Package *)lVar1._M_device,&local_9c,
                   (Scope **)&f);
        lVar2 = lock0;
        lVar1 = lock0_1;
        scope = std::unique_ptr<chatra::Scope,_std::default_delete<chatra::Scope>_>::get
                          ((unique_ptr<chatra::Scope,_std::default_delete<chatra::Scope>_> *)
                           (lock0._M_device + 0x30));
        Package::pushNodeFrame
                  ((Package *)lVar1._M_device,(Thread *)lVar2._M_device,(Package *)lVar1._M_device,2
                   ,scope,2);
        std::atomic<bool>::operator=((atomic<bool> *)(lock0_1._M_device + 0x68),false);
        lock0_1._M_device[0xb1].flag.super___atomic_flag_base._M_i = false;
        pvVar9 = std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::back
                           ((vector<chatra::Frame,_std::allocator<chatra::Frame>_> *)
                            (lock0._M_device + 0x68));
        pvVar9->phase = 0x7ffffffffffffffc;
        enqueue(this,(Thread *)lock0._M_device);
        return;
      }
      pIVar5 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
      memset(pIVar5,0,0x28);
      IllegalArgumentException::IllegalArgumentException(pIVar5);
      __cxa_throw(pIVar5,&IllegalArgumentException::typeinfo,
                  IllegalArgumentException::~IllegalArgumentException);
    }
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_false,_false>
             ::operator*(&__end2);
    this_00 = &ppVar6->second;
    pTVar7 = std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>::operator->
                       (this_00);
    if ((pTVar7->isInteractive & 1U) != 0) {
      pTVar7 = std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>::operator->
                         (this_00);
      bVar3 = std::atomic<bool>::load(&pTVar7->readyToNextInteraction,memory_order_seq_cst);
      if (!bVar3) {
        this_01 = (UnsupportedOperationException *)__cxa_allocate_exception(0x28);
        UnsupportedOperationException::UnsupportedOperationException
                  (this_01,"interaction instance (I%zu) is busy",interactiveInstanceId);
        __cxa_throw(this_01,&UnsupportedOperationException::typeinfo,
                    UnsupportedOperationException::~UnsupportedOperationException);
      }
      lock0._M_device =
           (mutex_type *)
           std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>::get(this_00);
    }
    std::__detail::
    _Node_iterator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>,_false,_false>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void RuntimeImp::push(InstanceId interactiveInstanceId, const std::string& scriptName,
		const std::string& statement) {

	auto* instance = instanceIds.lockAndRef(interactiveInstanceId);
	if (instance == nullptr)
		throw IllegalArgumentException();

	Thread* thread = nullptr;
	{
		std::lock_guard<SpinLock> lock0(instance->lockThreads);
		for (auto& e : instance->threads) {
			auto& t = e.second;
			if (!t->isInteractive)
				continue;
			if (!t->readyToNextInteraction.load())
				throw UnsupportedOperationException("interaction instance (I%zu) is busy",
						static_cast<size_t>(interactiveInstanceId));
			thread = t.get();
		}
	}
	if (thread == nullptr)
		throw IllegalArgumentException();

	thread->readyToNextInteraction = false;

	auto* package = packageIds.lockAndRef(instance->primaryPackageId);
	package->scripts.emplace_back(scriptName, statement);

	{
		std::lock_guard<SpinLock> lock0(lockTrashNodes);
		trashNodes.emplace_front(std::move(package->node));
		package->node = std::make_shared<Node>();
		package->node->type = NodeType::ScriptRoot;
		package->node->flags |= NodeFlags::InitialNode;
	}

	chatra_assert(thread->frames.size() == residentialFrameCount);
	thread->frames.emplace_back(*thread, *package, 1, package->scope.get());
	package->pushNodeFrame(*thread, *package, 2, thread->scriptScope.get(), 2);

	package->initialized = false;
	package->grouped = false;

	auto& f = thread->frames.back();
	chatra_assert(f.stack.empty());
	f.phase = Phase::ScriptRoot_InteractiveInitial;

	enqueue(thread);
}